

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cc
# Opt level: O2

Integer __thiscall calculator::ExpressionTree::calcValue(ExpressionTree *this,node *x,Tag tag)

{
  ulong uVar1;
  SyntaxError *this_00;
  NegateTypeException *this_01;
  allocator<char> local_41;
  string local_40;
  
  if (x == (node *)0x0) {
    this_00 = (SyntaxError *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"need one operator numbers",&local_41);
    SyntaxError::SyntaxError(this_00,&local_40);
    __cxa_throw(this_00,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
  }
  if (tag == Negate) {
    if (x->type != Number) {
      this_01 = (NegateTypeException *)__cxa_allocate_exception(0x28);
      NegateTypeException::NegateTypeException(this_01,x->value);
      __cxa_throw(this_01,&NegateTypeException::typeinfo,SyntaxError::~SyntaxError);
    }
    uVar1 = ~(long)x->value;
  }
  else if (tag == Not) {
    uVar1 = (ulong)((long)x->value == 0);
  }
  else {
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

Integer ExpressionTree::calcValue(node *x, Tag tag) {
    if (x == nullptr) throw SyntaxError("need one operator numbers");
    switch (tag) {
        case Tag::Not:
            return (Integer) !((Integer)x->value);
        case Tag::Negate:
            if (x->type != Tag::Number) {
                throw NegateTypeException(x->value);
            }
            return ~((Integer)x->value);
        default:
            break;
    }
    return 0;
}